

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
          *value)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  Rep *pRVar4;
  TestAllTypes_NestedMessage *pTVar5;
  
  iVar1 = this->current_size_;
  iVar2 = allocated_size(this);
  if (iVar1 < iVar2) {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    ppvVar3 = element_at(this,iVar1);
    proto2_unittest::TestAllTypes_NestedMessage::operator=
              ((TestAllTypes_NestedMessage *)*ppvVar3,value);
    return;
  }
  MaybeExtend(this);
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = rep(this);
    pRVar4->allocated_size = pRVar4->allocated_size + 1;
  }
  pTVar5 = Arena::
           CreateArenaCompatible<proto2_unittest::TestAllTypes_NestedMessage,proto2_unittest::TestAllTypes_NestedMessage>
                     (this->arena_,value);
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  ppvVar3 = element_at(this,iVar1);
  *ppvVar3 = pTVar5;
  return;
}

Assistant:

inline void Add(Value<TypeHandler>&& value) {
    static_assert(std::is_move_constructible<Value<TypeHandler>>::value, "");
    static_assert(std::is_move_assignable<Value<TypeHandler>>::value, "");
    if (current_size_ < allocated_size()) {
      *cast<TypeHandler>(element_at(ExchangeCurrentSize(current_size_ + 1))) =
          std::move(value);
      return;
    }
    MaybeExtend();
    if (!using_sso()) ++rep()->allocated_size;
    auto* result = TypeHandler::New(arena_, std::move(value));
    element_at(ExchangeCurrentSize(current_size_ + 1)) = result;
  }